

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O3

void strtoup(char *str)

{
  int iVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char cVar4;
  
  if ((str != (char *)0x0) && (cVar4 = *str, cVar4 != '\0')) {
    ppuVar2 = __ctype_b_loc();
    pcVar3 = str + 1;
    do {
      if ((~(*ppuVar2)[cVar4] & 0x600) == 0) {
        iVar1 = toupper((int)cVar4);
        pcVar3[-1] = (char)iVar1;
      }
      cVar4 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar4 != '\0');
  }
  return;
}

Assistant:

static void strtoup(char* str)
{
    if (str != NULL)
    {
        while (*str != '\0')
        {
            if (isalpha((int)*str) && islower((int)*str))
            {
                *str = (char)toupper((int)*str);
            }
            str++;
        }
    }
}